

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

array_container_t * array_container_create_range(uint32_t min,uint32_t max)

{
  uint16_t *puVar1;
  array_container_t *paVar2;
  long lVar3;
  
  paVar2 = array_container_create_given_capacity((max - min) + 1);
  if (paVar2 != (array_container_t *)0x0) {
    paVar2->cardinality = 0;
    if (min < max) {
      puVar1 = paVar2->array;
      lVar3 = 0;
      do {
        puVar1[lVar3] = (short)min + (short)lVar3;
        lVar3 = lVar3 + 1;
      } while (max - min != (int)lVar3);
      paVar2->cardinality = (int)lVar3;
    }
  }
  return paVar2;
}

Assistant:

array_container_t *array_container_create_range(uint32_t min, uint32_t max) {
    array_container_t *answer =
        array_container_create_given_capacity(max - min + 1);
    if (answer == NULL) return answer;
    answer->cardinality = 0;
    for (uint32_t k = min; k < max; k++) {
        answer->array[answer->cardinality++] = k;
    }
    return answer;
}